

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__profile_CG__newparam__surface__generator__name
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  bool bVar1;
  profile_CG__newparam__surface__generator__name__AttributeData *ppVar2;
  StringHash SVar3;
  undefined8 *puVar4;
  long *in_RSI;
  ParserChar *attributeValue;
  StringHash hash;
  ParserChar *attribute;
  ParserChar **attributeArray;
  profile_CG__newparam__surface__generator__name__AttributeData *attributeData;
  ParserChar *in_stack_00000098;
  ParserChar *in_stack_000000a0;
  StringHash in_stack_000000a8;
  ErrorType in_stack_000000b0;
  Severity in_stack_000000b4;
  ParserTemplateBase *in_stack_000000b8;
  void **in_stack_ffffffffffffffb8;
  ParserTemplateBase *in_stack_ffffffffffffffc0;
  undefined8 *local_38;
  bool local_1;
  
  ppVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL14::profile_CG__newparam__surface__generator__name__AttributeData>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_38 = (undefined8 *)*in_RSI;
  if (local_38 == (undefined8 *)0x0) {
LAB_008a591f:
    local_1 = true;
  }
  else {
    do {
      while( true ) {
        if ((ParserChar *)*local_38 == (ParserChar *)0x0) goto LAB_008a591f;
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash((ParserChar *)*local_38);
        puVar4 = local_38 + 1;
        if (puVar4 == (undefined8 *)0x0) {
          return false;
        }
        local_38 = local_38 + 2;
        if (SVar3 != 0x7a6c895) break;
        ppVar2->source = (ParserChar *)*puVar4;
      }
      bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,in_stack_000000a8,
                         in_stack_000000a0,in_stack_00000098);
    } while (!bVar1);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_CG__newparam__surface__generator__name( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_CG__newparam__surface__generator__name( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_CG__newparam__surface__generator__name__AttributeData* attributeData = newData<profile_CG__newparam__surface__generator__name__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_source:
    {

attributeData->source = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->source, strlen(attributeData->source));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_NAME,
            HASH_ATTRIBUTE_source,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_NAME, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}